

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O2

int gdAffineEqual(double *m1,double *m2)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((((ABS(*m1 - *m2) < 1e-06) && (ABS(m1[1] - m2[1]) < 1e-06)) && (ABS(m1[2] - m2[2]) < 1e-06))
     && ((ABS(m1[3] - m2[3]) < 1e-06 && (ABS(m1[4] - m2[4]) < 1e-06)))) {
    uVar1 = (uint)(ABS(m1[5] - m2[5]) < 1e-06);
  }
  return uVar1;
}

Assistant:

BGD_DECLARE(int) gdAffineEqual (const double m1[6], const double m2[6])
{
  return (fabs (m1[0] - m2[0]) < GD_EPSILON &&
	  fabs (m1[1] - m2[1]) < GD_EPSILON &&
	  fabs (m1[2] - m2[2]) < GD_EPSILON &&
	  fabs (m1[3] - m2[3]) < GD_EPSILON &&
	  fabs (m1[4] - m2[4]) < GD_EPSILON &&
	  fabs (m1[5] - m2[5]) < GD_EPSILON);
}